

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

int __thiscall RandomBotStrategy::chooseRandomCountry(RandomBotStrategy *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  result_type_conflict rVar2;
  uniform_int_distribution<int> dis;
  param_type local_8;
  
  pvVar1 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  local_8 = (param_type)
            ((ulong)((int)((ulong)((long)(pvVar1->
                                         super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                         )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pvVar1->
                                        super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start) >> 3) - 1) <<
            0x20);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_8,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)&stack0x00000008,&local_8);
  return rVar2;
}

Assistant:

int RandomBotStrategy::chooseRandomCountry(std::mt19937 gen) {
    int numberOfCountries = this->player->getOwnedCountries()->size();
    std::uniform_int_distribution<> dis(0, numberOfCountries - 1); // define the range
    return dis(gen);
}